

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5IterSetOutputsTokendata(Fts5Iter *pIter)

{
  int iVar1;
  Fts5TokenDataIter *pT;
  Fts5Iter *pFVar2;
  Fts5Index *p;
  Fts5PoslistReader *pFVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  Fts5PoslistReader *pFVar7;
  Fts5TokenDataMap *pFVar8;
  u8 *puVar9;
  uint uVar10;
  ulong uVar11;
  uint nByte;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long iRowid;
  long in_FS_OFFSET;
  i64 iPrev;
  i64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pT = pIter->pTokenDataIter;
  (pIter->base).nData = 0;
  (pIter->base).pData = (u8 *)0x0;
  uVar6 = (ulong)pT->nIter;
  iRowid = -0x8000000000000000;
  if ((long)uVar6 < 1) {
    iVar13 = 0;
    iVar5 = 0;
  }
  else {
    uVar11 = 0;
    iVar5 = 0;
    uVar12 = 0;
    do {
      pFVar2 = pT->apIter[uVar11];
      if ((pFVar2->base).bEof == '\0') {
        if ((iVar5 == 0) || (lVar14 = (pFVar2->base).iRowid, lVar14 < iRowid)) {
          iRowid = (pFVar2->base).iRowid;
          (pIter->base).pData = (pFVar2->base).pData;
          (pIter->base).nData = (pFVar2->base).nData;
          iVar5 = 1;
          uVar12 = uVar11 & 0xffffffff;
        }
        else {
          iVar5 = iVar5 + (uint)(lVar14 == iRowid);
        }
      }
      iVar13 = (int)uVar12;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  if (iVar5 == 0) {
    (pIter->base).bEof = '\x01';
  }
  else {
    p = pIter->pIndex;
    iVar1 = p->pConfig->eDetail;
    (pIter->base).bEof = '\0';
    (pIter->base).iRowid = iRowid;
    if ((iVar5 == 1) && (iVar1 == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        fts5TokendataIterAppendMap(p,pT,iVar13,0,iRowid,-1);
        return;
      }
      goto LAB_001e21f9;
    }
    if ((1 < iVar5) && (iVar1 != 1)) {
      local_40 = 0;
      if (pT->aPoslistReader == (Fts5PoslistReader *)0x0) {
        pFVar7 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&p->rc,uVar6 * 0x24);
        pT->aPoslistReader = pFVar7;
        if (pFVar7 == (Fts5PoslistReader *)0x0) goto LAB_001e1f50;
        pT->aPoslistToIter = (int *)(pFVar7 + pT->nIter);
      }
      if (pT->nIter < 1) {
        uVar10 = 0;
        iVar13 = 0;
      }
      else {
        lVar14 = 0;
        iVar13 = 0;
        uVar10 = 0;
        do {
          pFVar2 = pT->apIter[lVar14];
          if (iRowid == (pFVar2->base).iRowid) {
            pT->aPoslistToIter[(int)uVar10] = (int)lVar14;
            puVar9 = (pFVar2->base).pData;
            iVar4 = (pFVar2->base).nData;
            pFVar3 = pT->aPoslistReader;
            pFVar7 = pFVar3 + (int)uVar10;
            pFVar7->a = (u8 *)0x0;
            pFVar7->n = 0;
            pFVar7->i = 0;
            pFVar7->bFlag = '\0';
            pFVar7->bEof = '\0';
            *(undefined6 *)&pFVar7->field_0x12 = 0;
            pFVar7->iPos = 0;
            pFVar7->a = puVar9;
            pFVar7->n = iVar4;
            iVar4 = sqlite3Fts5PoslistNext64(puVar9,iVar4,&pFVar7->i,&pFVar3[(int)uVar10].iPos);
            if (iVar4 != 0) {
              pFVar3[(int)uVar10].bEof = '\x01';
            }
            uVar10 = uVar10 + 1;
            iVar13 = iVar13 + (pFVar2->base).nData;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < pT->nIter);
      }
      nByte = iVar13 + iVar5 * 10 + (pIter->poslist).n;
      if ((nByte <= (uint)(pIter->poslist).nSpace) ||
         (iVar5 = sqlite3Fts5BufferSize(&pIter->pIndex->rc,&pIter->poslist,nByte), iVar5 == 0)) {
        if ((iVar1 == 0) && (pT->nMapAlloc < pT->nMap + iVar13)) {
          iVar13 = pT->nMapAlloc + iVar13;
          pFVar8 = (Fts5TokenDataMap *)sqlite3_realloc(pT->aMap,iVar13 * 0x30);
          if (pFVar8 == (Fts5TokenDataMap *)0x0) {
            pIter->pIndex->rc = 7;
            goto LAB_001e1f50;
          }
          pT->aMap = pFVar8;
          pT->nMapAlloc = iVar13 * 2;
        }
        (pIter->poslist).n = 0;
        do {
          if ((int)uVar10 < 1) {
            lVar15 = 0;
            lVar14 = 0x7fffffffffffffff;
          }
          else {
            puVar9 = &pT->aPoslistReader->bEof;
            uVar6 = 0;
            lVar14 = 0x7fffffffffffffff;
            uVar11 = 0;
            do {
              if ((*puVar9 == '\0') && (*(long *)(puVar9 + 7) < lVar14)) {
                uVar11 = uVar6 & 0xffffffff;
                lVar14 = *(long *)(puVar9 + 7);
              }
              uVar6 = uVar6 + 1;
              puVar9 = puVar9 + 0x20;
            } while (uVar10 != uVar6);
            lVar15 = (long)(int)uVar11;
          }
          if (lVar14 == 0x7fffffffffffffff) break;
          sqlite3Fts5PoslistSafeAppend(&pIter->poslist,&local_40,lVar14);
          pFVar3 = pT->aPoslistReader;
          pFVar7 = pFVar3 + lVar15;
          iVar13 = sqlite3Fts5PoslistNext64(pFVar7->a,pFVar7->n,&pFVar7->i,&pFVar3[lVar15].iPos);
          if (iVar13 != 0) {
            pFVar3[lVar15].bEof = '\x01';
          }
          if (iVar1 == 0) {
            pFVar8 = pT->aMap;
            iVar13 = pT->nMap;
            pFVar8[iVar13].iPos = lVar14;
            pFVar8[iVar13].iIter = pT->aPoslistToIter[lVar15];
            pFVar8[iVar13].iRowid = iRowid;
            pT->nMap = iVar13 + 1;
          }
        } while (lVar14 != 0x7fffffffffffffff);
        (pIter->base).pData = (pIter->poslist).p;
        (pIter->base).nData = (pIter->poslist).n;
      }
    }
  }
LAB_001e1f50:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001e21f9:
  __stack_chk_fail();
}

Assistant:

static void fts5IterSetOutputsTokendata(Fts5Iter *pIter){
  int ii;
  int nHit = 0;
  i64 iRowid = SMALLEST_INT64;
  int iMin = 0;

  Fts5TokenDataIter *pT = pIter->pTokenDataIter;

  pIter->base.nData = 0;
  pIter->base.pData = 0;

  for(ii=0; ii<pT->nIter; ii++){
    Fts5Iter *p = pT->apIter[ii];
    if( p->base.bEof==0 ){
      if( nHit==0 || p->base.iRowid<iRowid ){
        iRowid = p->base.iRowid;
        nHit = 1;
        pIter->base.pData = p->base.pData;
        pIter->base.nData = p->base.nData;
        iMin = ii;
      }else if( p->base.iRowid==iRowid ){
        nHit++;
      }
    }
  }

  if( nHit==0 ){
    pIter->base.bEof = 1;
  }else{
    int eDetail = pIter->pIndex->pConfig->eDetail;
    pIter->base.bEof = 0;
    pIter->base.iRowid = iRowid;

    if( nHit==1 && eDetail==FTS5_DETAIL_FULL ){
      fts5TokendataIterAppendMap(pIter->pIndex, pT, iMin, 0, iRowid, -1);
    }else
    if( nHit>1 && eDetail!=FTS5_DETAIL_NONE ){
      int nReader = 0;
      int nByte = 0;
      i64 iPrev = 0;

      /* Allocate array of iterators if they are not already allocated. */
      if( pT->aPoslistReader==0 ){
        pT->aPoslistReader = (Fts5PoslistReader*)sqlite3Fts5MallocZero(
            &pIter->pIndex->rc,
            pT->nIter * (sizeof(Fts5PoslistReader) + sizeof(int))
        );
        if( pT->aPoslistReader==0 ) return;
        pT->aPoslistToIter = (int*)&pT->aPoslistReader[pT->nIter];
      }

      /* Populate an iterator for each poslist that will be merged */
      for(ii=0; ii<pT->nIter; ii++){
        Fts5Iter *p = pT->apIter[ii];
        if( iRowid==p->base.iRowid ){
          pT->aPoslistToIter[nReader] = ii;
          sqlite3Fts5PoslistReaderInit(
              p->base.pData, p->base.nData, &pT->aPoslistReader[nReader++]
          );
          nByte += p->base.nData;
        }
      }

      /* Ensure the output buffer is large enough */
      if( fts5BufferGrow(&pIter->pIndex->rc, &pIter->poslist, nByte+nHit*10) ){
        return;
      }

      /* Ensure the token-mapping is large enough */
      if( eDetail==FTS5_DETAIL_FULL && pT->nMapAlloc<(pT->nMap + nByte) ){
        int nNew = (pT->nMapAlloc + nByte) * 2;
        Fts5TokenDataMap *aNew = (Fts5TokenDataMap*)sqlite3_realloc(
            pT->aMap, nNew*sizeof(Fts5TokenDataMap)
        );
        if( aNew==0 ){
          pIter->pIndex->rc = SQLITE_NOMEM;
          return;
        }
        pT->aMap = aNew;
        pT->nMapAlloc = nNew;
      }

      pIter->poslist.n = 0;

      while( 1 ){
        i64 iMinPos = LARGEST_INT64;

        /* Find smallest position */
        iMin = 0;
        for(ii=0; ii<nReader; ii++){
          Fts5PoslistReader *pReader = &pT->aPoslistReader[ii];
          if( pReader->bEof==0 ){
            if( pReader->iPos<iMinPos ){
              iMinPos = pReader->iPos;
              iMin = ii;
            }
          }
        }

        /* If all readers were at EOF, break out of the loop. */
        if( iMinPos==LARGEST_INT64 ) break;

        sqlite3Fts5PoslistSafeAppend(&pIter->poslist, &iPrev, iMinPos);
        sqlite3Fts5PoslistReaderNext(&pT->aPoslistReader[iMin]);

        if( eDetail==FTS5_DETAIL_FULL ){
          pT->aMap[pT->nMap].iPos = iMinPos;
          pT->aMap[pT->nMap].iIter = pT->aPoslistToIter[iMin];
          pT->aMap[pT->nMap].iRowid = iRowid;
          pT->nMap++;
        }
      }

      pIter->base.pData = pIter->poslist.p;
      pIter->base.nData = pIter->poslist.n;
    }
  }
}